

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O1

Vec_Int_t * Acec_RankTrees(Gia_Man_t *p,Vec_Int_t *vXors,Vec_Int_t *vXorRoots)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint Entry;
  uint uVar4;
  int *piVar5;
  bool bVar6;
  uint uVar7;
  Vec_Int_t *p_00;
  int *piVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar8 = (int *)malloc(400);
  p_00->pArray = piVar8;
  iVar1 = p->nObjs;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar10 = iVar1;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar10;
  if (iVar10 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar10 << 2);
  }
  pVVar9->pArray = piVar8;
  pVVar9->nSize = iVar1;
  if (piVar8 != (int *)0x0) {
    memset(piVar8,0xff,(long)iVar1 << 2);
  }
  iVar10 = vXorRoots->nSize;
  if (0 < (long)iVar10) {
    piVar5 = vXorRoots->pArray;
    lVar11 = 0;
    do {
      iVar2 = piVar5[lVar11];
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_0067e7f0;
      piVar8[iVar2] = (int)lVar11;
      lVar11 = lVar11 + 1;
    } while (iVar10 != lVar11);
  }
  uVar3 = vXors->nSize;
  if (3 < (int)uVar3) {
    uVar7 = uVar3 & 0xfffffffc;
    uVar12 = (ulong)(uVar3 >> 2);
    do {
      uVar7 = uVar7 - 4;
      lVar11 = uVar12 * 4 + -4;
      if (vXors->nSize <= lVar11) {
LAB_0067e7b2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = vXors->pArray[lVar11];
      if (((long)iVar10 < 0) || (iVar1 <= iVar10)) goto LAB_0067e7b2;
      uVar3 = piVar8[iVar10];
      if (uVar3 != 0xffffffff) {
        uVar14 = (ulong)uVar7;
        lVar11 = 3;
        do {
          uVar14 = uVar14 + 1;
          if (vXors->nSize <= (int)uVar14) goto LAB_0067e7b2;
          Entry = vXors->pArray[uVar14];
          uVar13 = (ulong)Entry;
          if (uVar13 != 0) {
            if (((int)Entry < 0) || (iVar1 <= (int)Entry)) goto LAB_0067e7b2;
            uVar4 = piVar8[uVar13];
            if (uVar4 != uVar3) {
              if (uVar4 == 0xffffffff) {
                piVar8[uVar13] = uVar3;
              }
              else {
                Vec_IntPush(p_00,Entry);
                if (p->nObjs <= (int)Entry) {
                  __assert_fail("v >= 0 && v < p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                }
                if ((~*(uint *)(p->pObjs + uVar13) & 0x1fffffff) != 0 &&
                    -1 < (int)*(uint *)(p->pObjs + uVar13)) {
                  printf("Xor node %d belongs to Tree %d and Tree %d.\n",(ulong)Entry,(ulong)uVar4,
                         (ulong)uVar3);
                }
              }
            }
          }
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      bVar6 = 1 < (long)uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar6);
  }
  iVar10 = p_00->nSize;
  if (0 < (long)iVar10) {
    piVar5 = p_00->pArray;
    lVar11 = 0;
    do {
      iVar2 = piVar5[lVar11];
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
LAB_0067e7f0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar8[iVar2] = -1;
      lVar11 = lVar11 + 1;
    } while (iVar10 != lVar11);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return pVVar9;
}

Assistant:

Vec_Int_t * Acec_RankTrees( Gia_Man_t * p, Vec_Int_t * vXors, Vec_Int_t * vXorRoots )
{
    Vec_Int_t * vDoubles = Vec_IntAlloc( 100 );
    int i, k, Entry;
    // map roots into their ranks
    Vec_Int_t * vRanks = Vec_IntStartFull( Gia_ManObjNum(p) ); 
    Vec_IntForEachEntry( vXorRoots, Entry, i )
        Vec_IntWriteEntry( vRanks, Entry, i );
    // map nodes into their ranks
    for ( i = Vec_IntSize(vXors)/4 - 1; i >= 0; i-- )
    {
        int Root = Vec_IntEntry( vXors, 4*i );
        int Rank = Vec_IntEntry( vRanks, Root );
        // skip XORs that are not part of any tree
        if ( Rank == -1 )
            continue;
        // iterate through XOR inputs
        for ( k = 1; k < 4; k++ )
        {
            int Node = Vec_IntEntry( vXors, 4*i+k );
            if ( Node == 0 ) // HA
                continue;
            Entry = Vec_IntEntry( vRanks, Node );
            if ( Entry == Rank ) // the same tree
                continue;
            if ( Entry == -1 )
                Vec_IntWriteEntry( vRanks, Node, Rank );
            else
                Vec_IntPush( vDoubles, Node );

            if ( Entry != -1 && Gia_ObjIsAnd(Gia_ManObj(p, Node)))
            printf( "Xor node %d belongs to Tree %d and Tree %d.\n", Node, Entry, Rank );
        }
    }
    // remove duplicated entries
    Vec_IntForEachEntry( vDoubles, Entry, i )
        Vec_IntWriteEntry( vRanks, Entry, -1 );
    Vec_IntFree( vDoubles );
    return vRanks;
}